

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler_,
          sysbvm_tuple_t astNode,sysbvm_tuple_t breakLabel,sysbvm_tuple_t continueLabel)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t sVar3;
  undefined1 local_70 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_d4be5677 gcFrame;
  sysbvm_tuple_t continueLabel_local;
  sysbvm_tuple_t breakLabel_local;
  sysbvm_tuple_t astNode_local;
  sysbvm_functionBytecodeDirectCompiler_t *compiler__local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x20);
  gcFrameRecord.roots = (sysbvm_tuple_t *)compiler_;
  memset(local_70,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_70);
  sVar1 = gcFrameRecord.roots[4];
  sVar2 = gcFrameRecord.roots[5];
  gcFrameRecord.roots[4] = breakLabel;
  gcFrameRecord.roots[5] = continueLabel;
  sVar3 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                    (context,(sysbvm_functionBytecodeDirectCompiler_t *)gcFrameRecord.roots,astNode)
  ;
  gcFrameRecord.roots[4] = sVar1;
  gcFrameRecord.roots[5] = sVar2;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_70);
  return sVar3;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler_, sysbvm_tuple_t astNode, sysbvm_tuple_t breakLabel, sysbvm_tuple_t continueLabel)
{
    struct {
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t oldBreakLabel;
        sysbvm_tuple_t oldContinueLabel;
        sysbvm_tuple_t result;
    } gcFrame = {
        .compiler = compiler_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.oldBreakLabel = gcFrame.compiler->breakLabel;
    gcFrame.oldContinueLabel = gcFrame.compiler->continueLabel;
    gcFrame.compiler->breakLabel = breakLabel;
    gcFrame.compiler->continueLabel = continueLabel;

    gcFrame.result = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, astNode);

    gcFrame.compiler->breakLabel = gcFrame.oldBreakLabel;
    gcFrame.compiler->continueLabel = gcFrame.oldContinueLabel;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}